

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.h
# Opt level: O1

void __thiscall MeCab::Connector::Connector(Connector *this)

{
  Mmap<short> *this_00;
  
  this->_vptr_Connector = (_func_int **)&PTR__Connector_00172df0;
  this_00 = (Mmap<short> *)operator_new(0x1d8);
  Mmap<short>::Mmap(this_00);
  (this->cmmap_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00172e50;
  (this->cmmap_).ptr_ = this_00;
  this->matrix_ = (short *)0x0;
  this->lsize_ = 0;
  this->rsize_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->what_);
  (this->what_).str_._M_dataplus._M_p = (pointer)&(this->what_).str_.field_2;
  (this->what_).str_._M_string_length = 0;
  (this->what_).str_.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit Connector():
      cmmap_(new Mmap<short>), matrix_(0), lsize_(0), rsize_(0) {}